

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie_test.cc
# Opt level: O2

void large_test(void)

{
  timeval a;
  timeval a_00;
  timeval a_01;
  timeval a_02;
  timeval a_03;
  timeval b;
  timeval b_00;
  timeval b_01;
  timeval b_02;
  timeval b_03;
  timeval b_04;
  timeval b_05;
  timeval b_06;
  timeval b_07;
  timeval b_08;
  timeval a_04;
  timeval b_09;
  timeval b_10;
  timeval b_11;
  timeval b_12;
  timeval b_13;
  timeval b_14;
  timeval a_05;
  timeval a_06;
  timeval a_07;
  __time_t _Var1;
  __time_t _Var2;
  __suseconds_t _Var3;
  __suseconds_t _Var4;
  size_t sVar5;
  __time_t _Var6;
  __suseconds_t _Var7;
  uint32_t uVar8;
  hbtrie_result hVar9;
  int iVar10;
  void *pvVar11;
  void *pvVar12;
  filemgr_ops *ops;
  filemgr *file;
  btree_blk_ops *btree_blk_ops;
  char *pcVar13;
  bid_t bVar14;
  size_t sVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  filemgr_open_result fVar19;
  timeval tVar20;
  timeval tVar21;
  timeval a_08;
  timeval a_09;
  timeval a_10;
  timeval a_11;
  timeval a_12;
  timeval a_13;
  timeval a_14;
  timeval a_15;
  timeval a_16;
  uint64_t _offset;
  filemgr *local_8e0;
  timeval __test_cur;
  size_t keylen;
  timeval __test_begin;
  docio_object local_8a8;
  uint8_t valuebuf [8];
  docio_handle dhandle;
  hbtrie trie;
  btreeblk_handle bhandle;
  char meta [256];
  hbtrie_iterator it;
  char body [256];
  filemgr_config local_498;
  char dockey [256];
  char keybuf [256];
  char bodybuf [256];
  char metabuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  __test_cur.tv_sec = __test_begin.tv_sec;
  __test_cur.tv_usec = __test_begin.tv_usec;
  local_8a8.length.keylen = 0;
  local_8a8.length.metalen = 0;
  local_8a8.length.bodylen = 0;
  local_8a8.length.bodylen_ondisk = 0;
  local_8a8.length.flag = '\0';
  local_8a8.length.checksum = '\0';
  local_8a8.length.reserved = 0;
  local_8a8.timestamp = 0;
  local_8a8.field_3.seqnum = 0;
  keylen = 8;
  pvVar11 = malloc(800000);
  pvVar12 = malloc(800000);
  local_8a8.key = keybuf;
  local_8a8.meta = metabuf;
  local_8a8.body = bodybuf;
  local_498.prefetch_duration = 0;
  local_498.encryption_key.bytes[0] = '\0';
  local_498.encryption_key.bytes[1] = '\0';
  local_498.encryption_key.bytes[2] = '\0';
  local_498.encryption_key.bytes[3] = '\0';
  local_498.encryption_key.bytes[4] = '\0';
  local_498.encryption_key.bytes[5] = '\0';
  local_498.encryption_key.bytes[6] = '\0';
  local_498.encryption_key.bytes[7] = '\0';
  local_498.encryption_key.bytes[8] = '\0';
  local_498.encryption_key.bytes[9] = '\0';
  local_498.encryption_key.bytes[10] = '\0';
  local_498.encryption_key.bytes[0xb] = '\0';
  local_498.encryption_key.bytes[0xc] = '\0';
  local_498.encryption_key.bytes[0xd] = '\0';
  local_498.encryption_key.bytes[0xe] = '\0';
  local_498.encryption_key.bytes[0xf] = '\0';
  local_498.encryption_key.bytes[0x10] = '\0';
  local_498.encryption_key.bytes[0x11] = '\0';
  local_498.encryption_key.bytes[0x12] = '\0';
  local_498.encryption_key.bytes[0x13] = '\0';
  local_498.encryption_key.bytes[0x14] = '\0';
  local_498.encryption_key.bytes[0x15] = '\0';
  local_498.encryption_key.bytes[0x16] = '\0';
  local_498.encryption_key.bytes[0x17] = '\0';
  local_498.encryption_key.bytes[0x18] = '\0';
  local_498.encryption_key.bytes[0x19] = '\0';
  local_498.encryption_key.bytes[0x1a] = '\0';
  local_498.encryption_key.bytes[0x1b] = '\0';
  local_498.encryption_key.bytes[0x1c] = '\0';
  local_498.encryption_key.bytes[0x1d] = '\0';
  local_498.encryption_key.bytes[0x1e] = '\0';
  local_498.encryption_key.bytes[0x1f] = '\0';
  local_498.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  local_498.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  local_498.do_not_cache_doc_blocks = false;
  local_498._89_3_ = 0;
  local_498.num_blocks_readahead = 0;
  local_498.blocksize = 0x1000;
  local_498.ncacheblock = 0;
  local_498.flag = 0;
  local_498.chunksize = 8;
  local_498.options = '\b';
  local_498.seqtree_opt = '\0';
  local_498._18_6_ = 0;
  local_498.num_wal_shards = 8;
  local_498.num_bcache_shards = 0;
  local_498.encryption_key.algorithm = 0;
  puts("filemgr, bcache init .. ");
  system("rm -rf  hbtrie_testfile");
  ops = get_filemgr_ops();
  fVar19 = filemgr_open("./hbtrie_testfile",ops,&local_498,(err_log_callback *)0x0);
  file = fVar19.file;
  docio_init(&dhandle,file,false);
  local_8e0 = file;
  btreeblk_init(&bhandle,file,0x1000);
  btree_blk_ops = btreeblk_get_ops();
  hbtrie_init(&trie,8,8,0x1000,0xffffffffffffffff,&bhandle,btree_blk_ops,&dhandle,_readkey_wrap);
  _Var3 = __test_cur.tv_usec;
  _Var1 = __test_cur.tv_sec;
  gettimeofday((timeval *)&__test_cur,(__timezone_ptr_t)0x0);
  _Var7 = __test_begin.tv_usec;
  _Var6 = __test_begin.tv_sec;
  _Var4 = __test_cur.tv_usec;
  _Var2 = __test_cur.tv_sec;
  a_05.tv_usec = __test_begin.tv_usec;
  a_05.tv_sec = __test_begin.tv_sec;
  tVar21.tv_usec = __test_cur.tv_usec;
  tVar21.tv_sec = __test_cur.tv_sec;
  tVar20.tv_usec = __test_cur.tv_usec;
  tVar20.tv_sec = __test_cur.tv_sec;
  tVar20 = _utime_gap(a_05,tVar20);
  a_08.tv_usec = _Var3;
  a_08.tv_sec = _Var1;
  tVar21 = _utime_gap(a_08,tVar21);
  printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",tVar20.tv_sec,tVar20.tv_usec,
         tVar21.tv_sec,tVar21.tv_usec);
  puts("doc append .. ");
  uVar17 = 0;
  while( true ) {
    sVar5 = keylen;
    if (uVar17 == 100000) {
      gettimeofday((timeval *)&__test_cur,(__timezone_ptr_t)0x0);
      _Var3 = __test_cur.tv_usec;
      _Var1 = __test_cur.tv_sec;
      b_00.tv_usec = __test_cur.tv_usec;
      b_00.tv_sec = __test_cur.tv_sec;
      b.tv_usec = __test_cur.tv_usec;
      b.tv_sec = __test_cur.tv_sec;
      a_09.tv_usec = _Var7;
      a_09.tv_sec = _Var6;
      tVar20 = _utime_gap(a_09,b);
      a.tv_usec = _Var4;
      a.tv_sec = _Var2;
      tVar21 = _utime_gap(a,b_00);
      printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",tVar20.tv_sec,tVar20.tv_usec,
             tVar21.tv_sec,tVar21.tv_usec);
      puts("hbtrie update .. ");
      for (lVar16 = 0; lVar16 != 800000; lVar16 = lVar16 + 8) {
        pcVar13 = *(char **)((long)pvVar11 + lVar16);
        sVar15 = strlen(pcVar13);
        hbtrie_insert(&trie,pcVar13,(int)sVar15,(void *)((long)pvVar12 + lVar16),&_offset);
        btreeblk_end(&bhandle);
      }
      gettimeofday((timeval *)&__test_cur,(__timezone_ptr_t)0x0);
      b_02.tv_usec = __test_cur.tv_usec;
      b_02.tv_sec = __test_cur.tv_sec;
      b_01.tv_usec = __test_cur.tv_usec;
      b_01.tv_sec = __test_cur.tv_sec;
      a_10.tv_usec = _Var7;
      a_10.tv_sec = _Var6;
      tVar20 = _utime_gap(a_10,b_01);
      a_00.tv_usec = _Var3;
      a_00.tv_sec = _Var1;
      tVar21 = _utime_gap(a_00,b_02);
      printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",tVar20.tv_sec,tVar20.tv_usec,
             tVar21.tv_sec,tVar21.tv_usec);
      puts("filemgr commit .. ");
      filemgr_commit(local_8e0,true,(err_log_callback *)0x0);
      _Var3 = __test_cur.tv_usec;
      _Var1 = __test_cur.tv_sec;
      gettimeofday((timeval *)&__test_cur,(__timezone_ptr_t)0x0);
      _Var7 = __test_begin.tv_usec;
      _Var6 = __test_begin.tv_sec;
      _Var4 = __test_cur.tv_usec;
      _Var2 = __test_cur.tv_sec;
      a_06.tv_usec = __test_begin.tv_usec;
      a_06.tv_sec = __test_begin.tv_sec;
      b_04.tv_usec = __test_cur.tv_usec;
      b_04.tv_sec = __test_cur.tv_sec;
      b_03.tv_usec = __test_cur.tv_usec;
      b_03.tv_sec = __test_cur.tv_sec;
      tVar20 = _utime_gap(a_06,b_03);
      a_11.tv_usec = _Var3;
      a_11.tv_sec = _Var1;
      tVar21 = _utime_gap(a_11,b_04);
      printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",tVar20.tv_sec,tVar20.tv_usec,
             tVar21.tv_sec,tVar21.tv_usec);
      puts("doc append .. ");
      uVar17 = 0;
      while( true ) {
        if (uVar17 == 100000) {
          gettimeofday((timeval *)&__test_cur,(__timezone_ptr_t)0x0);
          _Var3 = __test_cur.tv_usec;
          _Var1 = __test_cur.tv_sec;
          b_06.tv_usec = __test_cur.tv_usec;
          b_06.tv_sec = __test_cur.tv_sec;
          b_05.tv_usec = __test_cur.tv_usec;
          b_05.tv_sec = __test_cur.tv_sec;
          a_12.tv_usec = _Var7;
          a_12.tv_sec = _Var6;
          tVar20 = _utime_gap(a_12,b_05);
          a_01.tv_usec = _Var4;
          a_01.tv_sec = _Var2;
          tVar21 = _utime_gap(a_01,b_06);
          printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",tVar20.tv_sec,tVar20.tv_usec
                 ,tVar21.tv_sec,tVar21.tv_usec);
          puts("hbtrie update .. ");
          for (lVar16 = 0; lVar16 != 800000; lVar16 = lVar16 + 8) {
            pcVar13 = *(char **)((long)pvVar11 + lVar16);
            sVar15 = strlen(pcVar13);
            hbtrie_insert(&trie,pcVar13,(int)sVar15,(void *)((long)pvVar12 + lVar16),&_offset);
            btreeblk_end(&bhandle);
          }
          gettimeofday((timeval *)&__test_cur,(__timezone_ptr_t)0x0);
          b_08.tv_usec = __test_cur.tv_usec;
          b_08.tv_sec = __test_cur.tv_sec;
          b_07.tv_usec = __test_cur.tv_usec;
          b_07.tv_sec = __test_cur.tv_sec;
          a_13.tv_usec = _Var7;
          a_13.tv_sec = _Var6;
          tVar20 = _utime_gap(a_13,b_07);
          a_02.tv_usec = _Var3;
          a_02.tv_sec = _Var1;
          tVar21 = _utime_gap(a_02,b_08);
          printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",tVar20.tv_sec,tVar20.tv_usec
                 ,tVar21.tv_sec,tVar21.tv_usec);
          puts("filemgr commit .. ");
          filemgr_commit(local_8e0,true,(err_log_callback *)0x0);
          a_04.tv_usec = __test_cur.tv_usec;
          a_04.tv_sec = __test_cur.tv_sec;
          gettimeofday((timeval *)&__test_cur,(__timezone_ptr_t)0x0);
          _Var3 = __test_cur.tv_usec;
          _Var1 = __test_cur.tv_sec;
          a_07.tv_usec = __test_begin.tv_usec;
          a_07.tv_sec = __test_begin.tv_sec;
          b_10.tv_usec = __test_cur.tv_usec;
          b_10.tv_sec = __test_cur.tv_sec;
          b_09.tv_usec = __test_cur.tv_usec;
          b_09.tv_sec = __test_cur.tv_sec;
          tVar20 = _utime_gap(a_07,b_09);
          tVar21 = _utime_gap(a_04,b_10);
          printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",tVar20.tv_sec,tVar20.tv_usec
                 ,tVar21.tv_sec,tVar21.tv_usec);
          puts("hbtrie search .. ");
          uVar17 = 0;
          while( true ) {
            if (uVar17 == 100000) {
              gettimeofday((timeval *)&__test_cur,(__timezone_ptr_t)0x0);
              _Var4 = __test_cur.tv_usec;
              _Var2 = __test_cur.tv_sec;
              b_12.tv_usec = __test_cur.tv_usec;
              b_12.tv_sec = __test_cur.tv_sec;
              b_11.tv_usec = __test_cur.tv_usec;
              b_11.tv_sec = __test_cur.tv_sec;
              a_14.tv_usec = __test_begin.tv_usec;
              a_14.tv_sec = __test_begin.tv_sec;
              tVar20 = _utime_gap(a_14,b_11);
              a_03.tv_usec = _Var3;
              a_03.tv_sec = _Var1;
              tVar21 = _utime_gap(a_03,b_12);
              printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",tVar20.tv_sec,
                     tVar20.tv_usec,tVar21.tv_sec,tVar21.tv_usec);
              puts("hbtrie iterator ..");
              hbtrie_iterator_init(&trie,&it,(void *)0x0,0);
              iVar10 = 100000;
              while( true ) {
                bVar18 = iVar10 == 0;
                iVar10 = iVar10 + -1;
                if (bVar18) {
                  hbtrie_iterator_free(&it);
                  gettimeofday((timeval *)&__test_cur,(__timezone_ptr_t)0x0);
                  b_14.tv_usec = __test_cur.tv_usec;
                  b_14.tv_sec = __test_cur.tv_sec;
                  b_13.tv_usec = __test_cur.tv_usec;
                  b_13.tv_sec = __test_cur.tv_sec;
                  a_15.tv_usec = __test_begin.tv_usec;
                  a_15.tv_sec = __test_begin.tv_sec;
                  tVar20 = _utime_gap(a_15,b_13);
                  a_16.tv_usec = _Var4;
                  a_16.tv_sec = _Var2;
                  tVar21 = _utime_gap(a_16,b_14);
                  printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",tVar20.tv_sec,
                         tVar20.tv_usec,tVar21.tv_sec,tVar21.tv_usec);
                  printf("trie root bid %lu\n",trie.root_bid);
                  filemgr_close(local_8e0,true,(char *)0x0,(err_log_callback *)0x0);
                  filemgr_shutdown();
                  pcVar13 = "%s PASSED\n";
                  if (large_test()::__test_pass != '\0') {
                    pcVar13 = "%s FAILED\n";
                  }
                  fprintf(_stderr,pcVar13,"large test");
                  return;
                }
                hVar9 = hbtrie_next(&it,keybuf,&keylen,&_offset);
                if (hVar9 == HBTRIE_RESULT_FAIL) break;
                btreeblk_end(&bhandle);
                docio_read_doc(&dhandle,_offset,&local_8a8,true);
              }
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                      ,0x166);
              large_test()::__test_pass = 1;
              __assert_fail("r != HBTRIE_RESULT_FAIL",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                            ,0x166,"void large_test()");
            }
            pcVar13 = *(char **)((long)pvVar11 + uVar17 * 8);
            sVar15 = strlen(pcVar13);
            hVar9 = hbtrie_find(&trie,pcVar13,(int)sVar15,valuebuf);
            btreeblk_end(&bhandle);
            if (hVar9 == HBTRIE_RESULT_FAIL) break;
            _offset._0_1_ = valuebuf[0];
            _offset._1_1_ = valuebuf[1];
            _offset._2_1_ = valuebuf[2];
            _offset._3_1_ = valuebuf[3];
            _offset._4_1_ = valuebuf[4];
            _offset._5_1_ = valuebuf[5];
            _offset._6_1_ = valuebuf[6];
            _offset._7_1_ = valuebuf[7];
            docio_read_doc(&dhandle,(uint64_t)valuebuf,&local_8a8,true);
            meta[0] = 'm';
            meta[1] = 'e';
            meta[2] = '\0';
            sprintf(body,"body2_%3d",uVar17 & 0xffffffff);
            iVar10 = bcmp(local_8a8.key,pcVar13,local_8a8.length._0_8_ & 0xffff);
            if (iVar10 != 0) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                      ,0x159);
              large_test()::__test_pass = '\x01';
              iVar10 = bcmp(local_8a8.key,pcVar13,local_8a8.length._0_8_ & 0xffff);
              if (iVar10 != 0) {
                __assert_fail("!memcmp(doc.key, key[i], doc.length.keylen)",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                              ,0x159,"void large_test()");
              }
            }
            iVar10 = bcmp(local_8a8.meta,meta,(ulong)local_8a8.length._0_8_ >> 0x10 & 0xffff);
            if (iVar10 != 0) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                      ,0x15a);
              large_test()::__test_pass = '\x01';
              iVar10 = bcmp(local_8a8.meta,meta,(ulong)local_8a8.length._0_8_ >> 0x10 & 0xffff);
              if (iVar10 != 0) {
                __assert_fail("!memcmp(doc.meta, meta, doc.length.metalen)",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                              ,0x15a,"void large_test()");
              }
            }
            iVar10 = bcmp(local_8a8.body,body,(ulong)local_8a8.length._0_8_ >> 0x20);
            if (iVar10 != 0) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                      ,0x15b);
              large_test()::__test_pass = '\x01';
              iVar10 = bcmp(local_8a8.body,body,(ulong)local_8a8.length._0_8_ >> 0x20);
              if (iVar10 != 0) {
                __assert_fail("!memcmp(doc.body, body, doc.length.bodylen)",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                              ,0x15b,"void large_test()");
              }
            }
            uVar17 = uVar17 + 1;
          }
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                  ,0x151);
          large_test()::__test_pass = 1;
          __assert_fail("r != HBTRIE_RESULT_FAIL",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                        ,0x151,"void large_test()");
        }
        strcpy(dockey,*(char **)((long)pvVar11 + uVar17 * 8));
        meta[0] = 'm';
        meta[1] = 'e';
        meta[2] = '\0';
        sprintf(body,"body2_%3d",uVar17 & 0xffffffff);
        uVar8 = _set_doc(&local_8a8,dockey,meta,body);
        if (uVar8 == 0) break;
        bVar14 = docio_append_doc(&dhandle,&local_8a8,'\0','\0');
        *(bid_t *)((long)pvVar12 + uVar17 * 8) = bVar14;
        uVar17 = uVar17 + 1;
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
              ,0x13a);
      large_test()::__test_pass = 1;
      __assert_fail("docsize != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                    ,0x13a,"void large_test()");
    }
    pcVar13 = (char *)malloc(keylen + 1);
    *(char **)((long)pvVar11 + uVar17 * 8) = pcVar13;
    _set_random_key(pcVar13,(int)sVar5);
    strcpy(dockey,pcVar13);
    meta[0] = 'm';
    meta[1] = '\0';
    sprintf(body,"body_%3d",uVar17 & 0xffffffff);
    uVar8 = _set_doc(&local_8a8,dockey,meta,body);
    if (uVar8 == 0) break;
    bVar14 = docio_append_doc(&dhandle,&local_8a8,'\0','\0');
    *(bid_t *)((long)pvVar12 + uVar17 * 8) = bVar14;
    uVar17 = uVar17 + 1;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
          ,0x121);
  large_test()::__test_pass = 1;
  __assert_fail("docsize != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                ,0x121,"void large_test()");
}

Assistant:

void large_test()
{
    TEST_INIT();

    int blocksize = 4096 * 1;
    struct btreeblk_handle bhandle;
    struct docio_handle dhandle;
    struct filemgr *file;
    struct hbtrie trie;
    struct docio_object doc;
    struct filemgr_config config;
    uint32_t docsize;
    char keybuf[256], metabuf[256], bodybuf[256];
    char dockey[256], meta[256], body[256];
    uint8_t valuebuf[8];
    hbtrie_result r;

    int i, k, n=100000, m=1, rr;
    size_t keylen = 8;
    char **key;
    uint64_t *offset;
    uint64_t _offset;

    key = (char **)malloc(sizeof(char*) * n);
    offset = (uint64_t *)malloc(sizeof(uint64_t) * n);

    doc.key = (void*)keybuf;
    doc.meta = (void*)metabuf;
    doc.body = (void*)bodybuf;

    memset(&config, 0, sizeof(config));
    config.blocksize = blocksize;
    config.ncacheblock = 0 * 1024 * 128;
    config.flag = 0;
    config.options = FILEMGR_CREATE;
    config.chunksize = sizeof(uint64_t);
    config.num_wal_shards = 8;

    DBG("filemgr, bcache init .. \n");
    rr = system(SHELL_DEL" hbtrie_testfile");
    (void)rr;
    filemgr_open_result result = filemgr_open((char *) "./hbtrie_testfile",
                                              get_filemgr_ops(), &config, NULL);
    file = result.file;
    docio_init(&dhandle, file, false);
    btreeblk_init(&bhandle, file, blocksize);

    hbtrie_init(&trie, 8, 8, blocksize, BLK_NOT_FOUND,
        (void*)&bhandle, btreeblk_get_ops(), (void*)&dhandle, _readkey_wrap);
    TEST_TIME();

    for (k=0;k<m;++k) {
        DBG("doc append .. \n");
        for (i=(n/m)*k;i<(n/m)*(k+1);++i){
            key[i] = (char *)malloc(keylen+1);
            _set_random_key(key[i], keylen);

            //DBG("%s\n", key[i]);
            sprintf(dockey, "%s", key[i]);
            sprintf(meta, "m");
            sprintf(body, "body_%3d", i);
            docsize = _set_doc(&doc, dockey, meta, body);
            TEST_CHK(docsize != 0);
            offset[i] = docio_append_doc(&dhandle, &doc, 0, 0);
        }
        TEST_TIME();

        DBG("hbtrie update .. \n");
        for (i=(n/m)*k;i<(n/m)*(k+1);++i){
            hbtrie_insert(&trie, (void*)key[i], strlen(key[i]),
                          (void*)&offset[i], (void*)&_offset);
            btreeblk_end(&bhandle);
        }
        TEST_TIME();

        DBG("filemgr commit .. \n");
        filemgr_commit(file, true, NULL);
        TEST_TIME();
    }

    for (k=0;k<m;++k) {
        DBG("doc append .. \n");
        for (i=(n/m)*k;i<(n/m)*(k+1);++i){
            sprintf(dockey, "%s", key[i]);
            sprintf(meta, "me");
            sprintf(body, "body2_%3d", i);
            docsize = _set_doc(&doc, dockey, meta, body);
            TEST_CHK(docsize != 0);
            offset[i] = docio_append_doc(&dhandle, &doc, 0, 0);
        }
        TEST_TIME();

        DBG("hbtrie update .. \n");
        for (i=(n/m)*k;i<(n/m)*(k+1);++i){
            hbtrie_insert(&trie, (void*)key[i], strlen(key[i]),
                          (void*)&offset[i], (void*)&_offset);
            btreeblk_end(&bhandle);
        }
        TEST_TIME();

        DBG("filemgr commit .. \n");
        filemgr_commit(file, true, NULL);
        TEST_TIME();
    }

    DBG("hbtrie search .. \n");
    for (i=0;i<n;++i) {
        //DBG("key %s\n", key[i]);
        r = hbtrie_find(&trie, (void*)key[i], strlen(key[i]), (void*)valuebuf);
        btreeblk_end(&bhandle);
        TEST_CHK(r != HBTRIE_RESULT_FAIL);

        if (r != HBTRIE_RESULT_FAIL) {
            memcpy(&_offset, valuebuf, 8);
            docio_read_doc(&dhandle, _offset, &doc, true);

            sprintf(meta, "me");
            sprintf(body, "body2_%3d", i);
            TEST_CHK(!memcmp(doc.key, key[i], doc.length.keylen));
            TEST_CHK(!memcmp(doc.meta, meta, doc.length.metalen));
            TEST_CHK(!memcmp(doc.body, body, doc.length.bodylen));

        }
    }
    TEST_TIME();

    DBG("hbtrie iterator ..\n");
    struct hbtrie_iterator it;
    hbtrie_iterator_init(&trie, &it, NULL, 0);
    for (i=0;i<n;++i){
        r = hbtrie_next(&it, (void*)keybuf, &keylen, (void*)&_offset);
        TEST_CHK(r != HBTRIE_RESULT_FAIL);
        btreeblk_end(&bhandle);
        docio_read_doc(&dhandle, _offset, &doc, true);
        /*
        keybuf[keylen] = 0;
        DBG("%s\n", keybuf);*/
    }
    hbtrie_iterator_free(&it);


    TEST_TIME();

    DBG("trie root bid %" _F64 "\n", trie.root_bid);

    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    TEST_RESULT("large test");
}